

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reverse.h
# Opt level: O2

void Eigen::internal::vectorwise_reverse_inplace_impl<0>::run<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *xpr)

{
  long n;
  PointerType local_c8;
  long lStack_c0;
  long local_b8;
  XprTypeNested pMStack_b0;
  long local_a8;
  long lStack_a0;
  Index local_98;
  RowsBlockXpr local_90;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> local_58 [56];
  
  n = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows / 2;
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topRows
            ((RowsBlockXpr *)local_58,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xpr,n)
  ;
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::bottomRows
            (&local_90,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xpr,n);
  local_98 = local_90.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_outerStride;
  local_a8 = local_90.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_startRow.m_value;
  lStack_a0 = local_90.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startCol.m_value;
  local_b8 = local_90.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value;
  pMStack_b0 = local_90.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_xpr;
  local_c8 = local_90.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_data;
  lStack_c0 = local_90.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value;
  DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
  swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>>
            (local_58,(DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
                       *)&local_c8);
  return;
}

Assistant:

static void run(ExpressionType &xpr)
  {
    Index half = xpr.rows()/2;
    xpr.topRows(half).swap(xpr.bottomRows(half).colwise().reverse());
  }